

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

uint64_t extract_pkg_name(char *path)

{
  uint uVar1;
  uint uVar2;
  size_t length;
  size_t sVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint uVar6;
  uint uVar7;
  
  length = strlen(path);
  uVar1 = rfind(path,'/');
  uVar2 = rfind(path,'.');
  uVar6 = 0xffffffff;
  if ((int)uVar1 <= (int)uVar2) {
    uVar6 = uVar2;
  }
  uVar7 = uVar6;
  if (uVar1 == 0xffffffff) {
    uVar7 = uVar2;
  }
  if ((uVar1 & uVar7) != 0xffffffff) {
    if (uVar1 == 0xffffffff) {
      length = (size_t)(int)uVar2;
    }
    else {
      sVar3 = (long)(int)uVar6;
      if (uVar7 == 0xffffffff) {
        sVar3 = length;
      }
      uVar4 = sVar3 - (long)(int)uVar1;
      if (uVar4 < 2) {
        return 0xffffffffffffffff;
      }
      length = uVar4 - 1;
      path = path + (long)(int)uVar1 + 1;
    }
  }
  uVar5 = hash_string(path,length);
  return uVar5;
}

Assistant:

uint64_t extract_pkg_name(char *path) {
	// Find the last path component
	size_t length = strlen(path);
	int last_path = rfind(path, '/');

	// Find the last `.` for the file extension
	int last_dot = rfind(path, '.');
	if (last_path != -1 && last_dot < last_path) {
		// The dot is before the final path component, so there's no file
		// extension
		last_dot = -1;
	}

	char *start;
	size_t actual_length;
	if (last_path == -1 && last_dot == -1) {
		// No path components and no file extension, the path itself is the name
		start = path;
		actual_length = length;
	} else if (last_path == -1) {
		// File extension, but no path components
		start = path;
		actual_length = (size_t) last_dot;
	} else {
		// Stop before the file extension if one exists
		size_t stop = length;
		if (last_dot != -1) {
			stop = (size_t) last_dot;
		}

		// Extract the last component into a new string
		if (stop - last_path <= 1) {
			return ~((uint64_t) 0);
		}
		start = &path[last_path + 1];
		actual_length = stop - last_path - 1;
	}

	return hash_string(start, actual_length);
}